

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_bitmask_set(uchar *mask,size_t offset,size_t len)

{
  ulong uVar1;
  size_t last_byte_idx;
  size_t first_byte_idx;
  uint end_bits;
  uint start_bits;
  size_t len_local;
  size_t offset_local;
  uchar *mask_local;
  
  first_byte_idx._4_4_ = 8 - ((uint)offset & 7);
  _end_bits = len;
  len_local = offset;
  if (first_byte_idx._4_4_ != 8) {
    uVar1 = offset >> 3;
    if (len <= first_byte_idx._4_4_) {
      for (; _end_bits != 0; _end_bits = _end_bits - 1) {
        mask[uVar1] = mask[uVar1] |
                      (byte)(1 << ((char)first_byte_idx._4_4_ - (char)_end_bits & 0x1fU));
      }
      return;
    }
    len_local = first_byte_idx._4_4_ + offset;
    _end_bits = len - first_byte_idx._4_4_;
    for (; first_byte_idx._4_4_ != 0; first_byte_idx._4_4_ = first_byte_idx._4_4_ - 1) {
      mask[uVar1] = mask[uVar1] | (byte)(1 << ((char)first_byte_idx._4_4_ - 1U & 0x1f));
    }
  }
  first_byte_idx._0_4_ = (uint)_end_bits & 7;
  if ((_end_bits & 7) != 0) {
    uVar1 = len_local + _end_bits >> 3;
    _end_bits = _end_bits - (uint)first_byte_idx;
    for (; (uint)first_byte_idx != 0; first_byte_idx._0_4_ = (uint)first_byte_idx - 1) {
      mask[uVar1] = mask[uVar1] | (byte)(1 << (8U - (char)(uint)first_byte_idx & 0x1f));
    }
  }
  memset(mask + (len_local >> 3),0xff,_end_bits >> 3);
  return;
}

Assistant:

static void ssl_bitmask_set( unsigned char *mask, size_t offset, size_t len )
{
    unsigned int start_bits, end_bits;

    start_bits = 8 - ( offset % 8 );
    if( start_bits != 8 )
    {
        size_t first_byte_idx = offset / 8;

        /* Special case */
        if( len <= start_bits )
        {
            for( ; len != 0; len-- )
                mask[first_byte_idx] |= 1 << ( start_bits - len );

            /* Avoid potential issues with offset or len becoming invalid */
            return;
        }

        offset += start_bits; /* Now offset % 8 == 0 */
        len -= start_bits;

        for( ; start_bits != 0; start_bits-- )
            mask[first_byte_idx] |= 1 << ( start_bits - 1 );
    }

    end_bits = len % 8;
    if( end_bits != 0 )
    {
        size_t last_byte_idx = ( offset + len ) / 8;

        len -= end_bits; /* Now len % 8 == 0 */

        for( ; end_bits != 0; end_bits-- )
            mask[last_byte_idx] |= 1 << ( 8 - end_bits );
    }

    memset( mask + offset / 8, 0xFF, len / 8 );
}